

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O2

void implementations::scheme::scheme_test(void)

{
  environment *this;
  ostream *poVar1;
  size_t __nbytes;
  size_t __nbytes_00;
  size_t __nbytes_01;
  cell *exp;
  env_p env;
  cell result;
  string line;
  allocator local_219;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_218;
  env_p local_208;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_1f8;
  allocator local_1e8 [32];
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_1c8;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_1b8;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_1a8;
  cell local_198;
  cell local_140;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [16];
  cell local_c8;
  cell local_70;
  
  local_e8 = local_d8;
  local_e0 = 0;
  local_d8[0] = 0;
  this = (environment *)operator_new(0x98);
  local_208.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_208.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  environment::environment(this,&local_208);
  std::__shared_ptr<implementations::scheme::environment,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<implementations::scheme::environment,void>
            ((__shared_ptr<implementations::scheme::environment,(__gnu_cxx::_Lock_policy)2> *)
             &local_218,this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_208.
              super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1a8,&local_218);
  add_globals(local_1a8._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8._M_refcount);
  std::__cxx11::string::string
            ((string *)&local_198,"(define multiply-by (lambda (n) (lambda (y) (* y n))))",local_1e8
            );
  read((int)&local_140,&local_198,__nbytes);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1b8,&local_218);
  eval(&local_70,&local_140,(env_p *)&local_1b8);
  cell::~cell(&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8._M_refcount);
  cell::~cell(&local_140);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::string((string *)&local_198,"(define doubler (multiply-by 2))",local_1e8);
  read((int)&local_140,&local_198,__nbytes_00);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1c8,&local_218);
  eval(&local_c8,&local_140,(env_p *)&local_1c8);
  cell::~cell(&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c8._M_refcount);
  cell::~cell(&local_140);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::string((string *)local_1e8,"(doubler 4)",&local_219);
  read((int)&local_198,local_1e8,__nbytes_01);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1f8,&local_218);
  eval(&local_140,&local_198,(env_p *)&local_1f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f8._M_refcount);
  cell::~cell(&local_198);
  std::__cxx11::string::~string((string *)local_1e8);
  to_string_abi_cxx11_((string *)&local_198,(scheme *)&local_140,exp);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_198);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_198);
  cell::~cell(&local_140);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_218._M_refcount);
  std::__cxx11::string::~string((string *)&local_e8);
  return;
}

Assistant:

void execute() {
		if (isResolved())
			return;
		if (subframe != nullptr) {
			subframe->execute();
			if (subframe->isResolved()) {
				// Copy results
				cell res(subframe->result);
				auto mode = subframe_mode;
				DEBUG("  subframe(" + std::string((mode == Argument ? "arg" : "proc")) + ") = " + to_string(res));
				// Clear subframe
				delete subframe;
				subframe = nullptr;
				subframe_mode = None;
				// Do something with result
				switch (mode) {
				case Argument:
					resolved_arguments.push_back(res);
					++arg_it;
					nextArgument();
					break;
				case Procedure:
					result = res;
					nextExpression();
					break;
				default:
					throw std::runtime_error("Invalid subframe mode None");
				}
			}
		}  else if (arg_it == arguments.cend())
			dispatch();
		else
			nextArgument();
	}